

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void upb::generator::WriteMiniTableMultipleSources
               (DefPoolPair *pools,FileDefPtr file,MiniTableOptions *options,
               GeneratorContext *context)

{
  MessageDefPtr message;
  EnumDefPtr e;
  FieldDefPtr ext;
  MiniTableOptions *options_00;
  GeneratorContext *pGVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Output *pOVar5;
  GeneratorContext *pGVar6;
  FileDefPtr file_00;
  FileDefPtr file_01;
  FileDefPtr file_02;
  int *in_R9;
  pointer pMVar7;
  pointer pEVar8;
  pointer pFVar9;
  string_view src;
  string_view src_00;
  string_view src_01;
  string_view full_name;
  string_view full_name_00;
  string_view full_name_01;
  Output output;
  int i;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> enums;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> extensions;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> messages;
  Output local_118;
  char local_f4 [4];
  FileDefPtr local_f0;
  string local_e8;
  pointer local_c8;
  MiniTableOptions *local_c0;
  GeneratorContext *local_b8;
  DefPoolPair *local_b0;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> local_a8;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> local_90;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> local_78;
  LogMessageFatal local_60;
  LogMessageFatal local_50;
  LogMessageFatal local_40;
  long *plVar4;
  
  pGVar6 = context;
  local_b0 = pools;
  SortedMessages(&local_78,file);
  SortedExtensions(&local_90,file);
  local_c0 = options;
  local_b8 = context;
  SortedEnums(&local_a8,file,kClosedEnums);
  local_f4[0] = '\0';
  local_f4[1] = '\0';
  local_f4[2] = '\0';
  local_f4[3] = '\0';
  local_f0.ptr_ =
       (upb_FileDef *)
       local_78.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (local_78.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pMVar7 = local_78.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      options_00 = local_c0;
      message.ptr_ = pMVar7->ptr_;
      local_118.output_._M_dataplus._M_p = (pointer)&local_118.output_.field_2;
      local_118.output_._M_string_length = 0;
      local_118.output_.field_2._M_local_buf[0] = '\0';
      WriteMiniTableSourceIncludes(file,local_c0,&local_118);
      pOVar5 = &local_118;
      anon_unknown_7::WriteMessage(message,local_b0,options_00,&local_118);
      upb_MessageDef_FullName(message.ptr_);
      full_name._M_str = local_f4;
      full_name._M_len = (size_t)pOVar5;
      MultipleSourceFilename_abi_cxx11_(&local_e8,(generator *)file.ptr_,file_00,full_name,in_R9);
      iVar3 = (*local_b8->_vptr_GeneratorContext[2])(local_b8,&local_e8);
      plVar4 = (long *)CONCAT44(extraout_var,iVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      pGVar6 = (GeneratorContext *)0x9;
      src._M_str = local_118.output_._M_dataplus._M_p;
      src._M_len = local_118.output_._M_string_length;
      absl::lts_20250127::Cord::Cord((Cord *)&local_e8,src,kConstructorString);
      cVar2 = (**(code **)(*plVar4 + 0x38))(plVar4,&local_e8);
      if (cVar2 == '\0') {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/minitable/generator.cc"
                   ,0x1c6,"stream->WriteCord(absl::Cord(output.output()))");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
      }
      absl::lts_20250127::Cord::~Cord((Cord *)&local_e8);
      (**(code **)(*plVar4 + 8))(plVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.output_._M_dataplus._M_p != &local_118.output_.field_2) {
        operator_delete(local_118.output_._M_dataplus._M_p,
                        CONCAT71(local_118.output_.field_2._M_allocated_capacity._1_7_,
                                 local_118.output_.field_2._M_local_buf[0]) + 1);
      }
      pMVar7 = pMVar7 + 1;
    } while ((upb_FileDef *)pMVar7 != local_f0.ptr_);
  }
  pGVar1 = local_b8;
  local_c8 = local_a8.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_f0.ptr_ = file.ptr_;
  if (local_a8.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a8.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pEVar8 = local_a8.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      e.ptr_ = pEVar8->ptr_;
      local_118.output_._M_dataplus._M_p = (pointer)&local_118.output_.field_2;
      local_118.output_._M_string_length = 0;
      local_118.output_.field_2._M_local_buf[0] = '\0';
      WriteMiniTableSourceIncludes(local_f0,local_c0,&local_118);
      anon_unknown_7::WriteEnum(e,&local_118);
      upb_EnumDef_FullName(e.ptr_);
      full_name_00._M_str = local_f4;
      full_name_00._M_len = (size_t)pGVar6;
      MultipleSourceFilename_abi_cxx11_
                (&local_e8,(generator *)local_f0.ptr_,file_01,full_name_00,in_R9);
      iVar3 = (*pGVar1->_vptr_GeneratorContext[2])(pGVar1,&local_e8);
      plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      pGVar6 = (GeneratorContext *)0x9;
      src_00._M_str = local_118.output_._M_dataplus._M_p;
      src_00._M_len = local_118.output_._M_string_length;
      absl::lts_20250127::Cord::Cord((Cord *)&local_e8,src_00,kConstructorString);
      cVar2 = (**(code **)(*plVar4 + 0x38))(plVar4,&local_e8);
      if (cVar2 == '\0') {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/minitable/generator.cc"
                   ,0x1ce,"stream->WriteCord(absl::Cord(output.output()))");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_50);
      }
      absl::lts_20250127::Cord::~Cord((Cord *)&local_e8);
      (**(code **)(*plVar4 + 8))(plVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.output_._M_dataplus._M_p != &local_118.output_.field_2) {
        operator_delete(local_118.output_._M_dataplus._M_p,
                        CONCAT71(local_118.output_.field_2._M_allocated_capacity._1_7_,
                                 local_118.output_.field_2._M_local_buf[0]) + 1);
      }
      pEVar8 = pEVar8 + 1;
    } while (pEVar8 != local_c8);
  }
  local_c8 = (pointer)local_90.
                      super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
  if (local_90.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_90.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pFVar9 = local_90.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      ext.ptr_ = pFVar9->ptr_;
      local_118.output_._M_dataplus._M_p = (pointer)&local_118.output_.field_2;
      local_118.output_._M_string_length = 0;
      local_118.output_.field_2._M_local_buf[0] = '\0';
      WriteMiniTableSourceIncludes(local_f0,local_c0,&local_118);
      anon_unknown_7::WriteExtension(local_b0,ext,&local_118);
      upb_FieldDef_FullName(ext.ptr_);
      full_name_01._M_str = local_f4;
      full_name_01._M_len = (size_t)pGVar6;
      MultipleSourceFilename_abi_cxx11_
                (&local_e8,(generator *)local_f0.ptr_,file_02,full_name_01,in_R9);
      iVar3 = (*pGVar1->_vptr_GeneratorContext[2])(pGVar1,&local_e8);
      plVar4 = (long *)CONCAT44(extraout_var_01,iVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      pGVar6 = (GeneratorContext *)0x9;
      src_01._M_str = local_118.output_._M_dataplus._M_p;
      src_01._M_len = local_118.output_._M_string_length;
      absl::lts_20250127::Cord::Cord((Cord *)&local_e8,src_01,kConstructorString);
      cVar2 = (**(code **)(*plVar4 + 0x38))(plVar4,&local_e8);
      if (cVar2 == '\0') {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_60,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/minitable/generator.cc"
                   ,0x1d6,"stream->WriteCord(absl::Cord(output.output()))");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_60);
      }
      absl::lts_20250127::Cord::~Cord((Cord *)&local_e8);
      (**(code **)(*plVar4 + 8))(plVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.output_._M_dataplus._M_p != &local_118.output_.field_2) {
        operator_delete(local_118.output_._M_dataplus._M_p,
                        CONCAT71(local_118.output_.field_2._M_allocated_capacity._1_7_,
                                 local_118.output_.field_2._M_local_buf[0]) + 1);
      }
      pFVar9 = pFVar9 + 1;
    } while ((pointer)pFVar9 != local_c8);
  }
  if (local_a8.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void WriteMiniTableMultipleSources(
    const DefPoolPair& pools, upb::FileDefPtr file,
    const MiniTableOptions& options,
    google::protobuf::compiler::GeneratorContext* context) {
  std::vector<upb::MessageDefPtr> messages = SortedMessages(file);
  std::vector<upb::FieldDefPtr> extensions = SortedExtensions(file);
  std::vector<upb::EnumDefPtr> enums = SortedEnums(file, kClosedEnums);
  int i = 0;

  for (auto message : messages) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteMessage(message, pools, options, output);
    auto stream = absl::WrapUnique(
        context->Open(MultipleSourceFilename(file, message.full_name(), &i)));
    ABSL_CHECK(stream->WriteCord(absl::Cord(output.output())));
  }
  for (const auto e : enums) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteEnum(e, output);
    auto stream = absl::WrapUnique(
        context->Open(MultipleSourceFilename(file, e.full_name(), &i)));
    ABSL_CHECK(stream->WriteCord(absl::Cord(output.output())));
  }
  for (const auto ext : extensions) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteExtension(pools, ext, output);
    auto stream = absl::WrapUnique(
        context->Open(MultipleSourceFilename(file, ext.full_name(), &i)));
    ABSL_CHECK(stream->WriteCord(absl::Cord(output.output())));
  }
}